

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::DatabaseBackedPoolTest_RollbackAfterError_Test::
~DatabaseBackedPoolTest_RollbackAfterError_Test
          (DatabaseBackedPoolTest_RollbackAfterError_Test *this)

{
  (this->super_DatabaseBackedPoolTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DatabaseBackedPoolTest_018e8930;
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_DatabaseBackedPoolTest).database_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x78);
  return;
}

Assistant:

TEST_F(DatabaseBackedPoolTest, RollbackAfterError) {
  // Make sure that all traces of bad types are removed from the pool. This used
  // to be b/4529436, due to the fact that a symbol resolution failure could
  // potentially cause another file to be recursively built, which would trigger
  // a checkpoint _past_ possibly invalid symbols.
  // Baz is defined in the database, but the file is invalid because it is
  // missing a necessary import.
  DescriptorPool pool(&database_);
  EXPECT_TRUE(pool.FindMessageTypeByName("Baz") == nullptr);
  // Make sure that searching again for the file or the type fails.
  EXPECT_TRUE(pool.FindFileByName("baz.proto") == nullptr);
  EXPECT_TRUE(pool.FindMessageTypeByName("Baz") == nullptr);
}